

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dot.h
# Opt level: O1

RealScalar __thiscall
Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::norm
          (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this)

{
  double dVar1;
  scalar_sum_op<double,_double> local_31;
  XprType local_30;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_20;
  
  local_20.m_evaluator.
  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_outerStride.
  m_value = *(long *)(this + 8);
  if (*(long *)(this + 0x10) == 0 ||
      local_20.m_evaluator.
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
      .m_argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
      m_outerStride.m_value == 0) {
    dVar1 = 0.0;
  }
  else {
    local_30.m_xpr = (XprTypeNested)this;
    if ((local_20.m_evaluator.
         super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
         .m_argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
         m_outerStride.m_value < 1) || (*(long *)(this + 0x10) < 1)) {
      __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Redux.h"
                    ,0x19d,
                    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, -1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, -1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                   );
    }
    local_20.m_evaluator.
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data =
         *(Scalar **)this;
    local_20.m_xpr = &local_30;
    dVar1 = internal::
            redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_3,_0>
            ::run(&local_20,&local_31);
  }
  return SQRT(dVar1);
}

Assistant:

EIGEN_STRONG_INLINE typename NumTraits<typename internal::traits<Derived>::Scalar>::Real MatrixBase<Derived>::norm() const
{
  return numext::sqrt(squaredNorm());
}